

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::IO_Action_PDU::IO_Action_PDU(IO_Action_PDU *this,Header *H,KDataStream *stream)

{
  IO_Header::IO_Header(&this->super_IO_Header,H);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Action_PDU_00223688;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RecEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_AtkEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TgtEntityID);
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vStdVarRecs).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_IO_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

IO_Action_PDU::IO_Action_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    IO_Header( H )
{
    Decode( stream, true );
}